

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

UTF8Decoded __thiscall llvm::yaml::Scanner::decodeUTF8(Scanner *this,iterator Position)

{
  UTF8Decoded UVar1;
  StringRef local_30;
  iterator local_20;
  iterator Position_local;
  Scanner *this_local;
  
  local_20 = Position;
  Position_local = (iterator)this;
  StringRef::StringRef(&local_30,Position,(long)this->End - (long)Position);
  UVar1 = ::decodeUTF8(local_30);
  return UVar1;
}

Assistant:

UTF8Decoded decodeUTF8(StringRef::iterator Position) {
    return ::decodeUTF8(StringRef(Position, End - Position));
  }